

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> __thiscall
enact::Parser::parseFunctionStmt(Parser *this,bool mustParseBody)

{
  undefined1 auVar1 [8];
  bool bVar2;
  undefined4 in_EDX;
  pointer *__ptr;
  undefined7 in_register_00000031;
  Parser *this_00;
  undefined1 local_108 [8];
  undefined1 local_100 [8];
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [2];
  undefined1 local_c8 [32];
  vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_> params;
  undefined1 local_88 [40];
  Token name;
  
  this_00 = (Parser *)CONCAT71(in_register_00000031,mustParseBody);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"Expected function name.",(allocator<char> *)&name);
  expect(this_00,IDENTIFIER,(string *)local_f8);
  std::__cxx11::string::~string((string *)local_f8);
  Token::Token(&name,&this_00->m_previous);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"Expected \'(\' after function name.",(allocator<char> *)local_88);
  expect(this_00,LEFT_PAREN,(string *)local_f8);
  std::__cxx11::string::~string((string *)local_f8);
  params.super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  params.super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  params.super__Vector_base<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = consume(this_00,RIGHT_PAREN);
  local_c8[0x1c] = (char)in_EDX;
  if (!bVar2) {
    local_c8._28_4_ = in_EDX;
    local_88._32_8_ = this;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f8,"Expected parameter name.",(allocator<char> *)local_88);
      expect(this_00,IDENTIFIER,(string *)local_f8);
      std::__cxx11::string::~string((string *)local_f8);
      Token::Token((Token *)local_f8,&this_00->m_previous);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_88,"Expected parameter typename.",(allocator<char> *)local_108);
      expectTypenamePrecFunction((Parser *)local_c8,(string *)this_00,SUB81((string *)local_88,0));
      std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::
      emplace_back<enact::FunctionStmt::Param>(&params,(Param *)local_f8);
      FunctionStmt::Param::~Param((Param *)local_f8);
      std::__cxx11::string::~string((string *)local_88);
      bVar2 = consume(this_00,COMMA);
    } while (bVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,"Expected end of parameter list.",(allocator<char> *)local_88);
    expect(this_00,RIGHT_PAREN,(string *)local_f8);
    this = (Parser *)local_88._32_8_;
    std::__cxx11::string::~string((string *)local_f8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"Expected return typename.",(allocator<char> *)local_108);
  expectTypenamePrecUnary((Parser *)local_88,(string *)this_00,SUB81(local_f8,0));
  std::__cxx11::string::~string((string *)local_f8);
  if ((local_c8[0x1c] == '\0') && ((this_00->m_current).type == SEMICOLON)) {
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = 0;
    local_e8[0]._M_allocated_capacity = 0;
    std::make_unique<enact::UnitExpr,enact::Token&>((Token *)(local_c8 + 0x10));
    std::
    make_unique<enact::BlockExpr,std::vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>,std::unique_ptr<enact::UnitExpr,std::default_delete<enact::UnitExpr>>>
              ((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
                *)local_100,
               (unique_ptr<enact::UnitExpr,_std::default_delete<enact::UnitExpr>_> *)local_f8);
    std::
    make_unique<enact::FunctionStmt,enact::Token&,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<enact::FunctionStmt::Param,std::allocator<enact::FunctionStmt::Param>>,std::unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>>>
              ((Token *)local_108,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               &name,(vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                      *)local_88,
               (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)&params);
    auVar1 = local_108;
    local_108 = (undefined1  [8])0x0;
    *(undefined1 (*) [8])this = auVar1;
    if (local_100 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_100 + 8))();
    }
    local_100 = (undefined1  [8])0x0;
    if ((long *)local_c8._16_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c8._16_8_ + 8))();
    }
    std::
    vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
    ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
               *)local_f8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,"Expected \'{\' or \'=>\' before function body.",
               (allocator<char> *)local_100);
    expectBlock((Parser *)local_108,(string *)this_00);
    std::__cxx11::string::~string((string *)local_f8);
    std::
    make_unique<enact::FunctionStmt,enact::Token,std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::vector<enact::FunctionStmt::Param,std::allocator<enact::FunctionStmt::Param>>,std::unique_ptr<enact::BlockExpr,std::default_delete<enact::BlockExpr>>>
              ((Token *)local_f8,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               &name,(vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>
                      *)local_88,
               (unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *)&params);
    this->m_context = local_f8._0_8_;
    if (local_108 != (undefined1  [8])0x0) {
      (**(code **)((((string *)local_108)->_M_dataplus)._M_p + 8))();
    }
  }
  if ((CompileContext *)local_88._0_8_ != (CompileContext *)0x0) {
    (**(code **)((((string *)local_88._0_8_)->_M_dataplus)._M_p + 8))();
  }
  std::vector<enact::FunctionStmt::Param,_std::allocator<enact::FunctionStmt::Param>_>::~vector
            (&params);
  std::__cxx11::string::~string((string *)&name.lexeme);
  return (__uniq_ptr_data<enact::Stmt,_std::default_delete<enact::Stmt>,_true,_true>)
         (tuple<enact::Stmt_*,_std::default_delete<enact::Stmt>_>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::parseFunctionStmt(bool mustParseBody) {
        expect(TokenType::IDENTIFIER, "Expected function name.");
        Token name = m_previous;

        expect(TokenType::LEFT_PAREN, "Expected '(' after function name.");

        std::vector<FunctionStmt::Param> params;
        if (!consume(TokenType::RIGHT_PAREN)) {
            do {
                expect(TokenType::IDENTIFIER, "Expected parameter name.");
                params.push_back(FunctionStmt::Param{m_previous, expectTypename("Expected parameter typename.")});
            } while (consume(TokenType::COMMA));

            expect(TokenType::RIGHT_PAREN, "Expected end of parameter list.");
        }

        // Get the return type
        // At second-lowest precedence to force grouping of function types (because of => ambiguity)
        std::unique_ptr<const Typename> returnTypename =
                expectTypenamePrecUnary("Expected return typename.", true);

        if (!mustParseBody && check(TokenType::SEMICOLON)) {
            return std::make_unique<FunctionStmt>(name,
                                                  std::move(returnTypename),
                                                  std::move(params),
                                                  std::make_unique<BlockExpr>(std::vector<std::unique_ptr<Stmt>>{},
                                                                              std::make_unique<UnitExpr>(m_previous)));
        }

        std::unique_ptr<BlockExpr> body = expectBlock("Expected '{' or '=>' before function body.");
        return std::make_unique<FunctionStmt>(std::move(name), std::move(returnTypename), std::move(params), std::move(body));
    }